

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O1

void pffft_zreorder(PFFFT_Setup *setup,float *in,float *out,pffft_direction_t direction)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  if (in == out) {
    __assert_fail("in != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x51a,
                  "void pffft_zreorder(PFFFT_Setup *, const float *, float *, pffft_direction_t)");
  }
  if (setup->transform == PFFFT_REAL) {
    iVar12 = setup->N;
    iVar13 = iVar12 + 0x1f;
    if (-1 < iVar12) {
      iVar13 = iVar12;
    }
    uVar6 = iVar13 >> 5;
    if (direction == PFFFT_FORWARD) {
      if (0x1f < iVar12) {
        lVar14 = 0;
        do {
          pfVar7 = in + lVar14;
          fVar1 = *pfVar7;
          fVar17 = pfVar7[1];
          fVar16 = pfVar7[3];
          pfVar9 = in + lVar14 + 4;
          fVar19 = *pfVar9;
          fVar15 = pfVar9[1];
          fVar18 = pfVar9[2];
          fVar20 = pfVar9[3];
          pfVar9 = (float *)((long)out + lVar14 + 0x10);
          *pfVar9 = pfVar7[2];
          pfVar9[1] = fVar18;
          pfVar9[2] = fVar16;
          pfVar9[3] = fVar20;
          pfVar7 = (float *)((long)out + lVar14);
          *pfVar7 = fVar1;
          pfVar7[1] = fVar19;
          pfVar7[2] = fVar17;
          pfVar7[3] = fVar15;
          pfVar9 = in + lVar14 + 0x10;
          fVar1 = *pfVar9;
          fVar17 = pfVar9[1];
          fVar16 = pfVar9[3];
          pfVar7 = in + lVar14 + 0x14;
          fVar19 = *pfVar7;
          fVar15 = pfVar7[1];
          fVar18 = pfVar7[2];
          fVar20 = pfVar7[3];
          pfVar7 = (float *)((long)out + lVar14 + (ulong)(uVar6 * 4) * 0x10 + 0x10);
          *pfVar7 = pfVar9[2];
          pfVar7[1] = fVar18;
          pfVar7[2] = fVar16;
          pfVar7[3] = fVar20;
          pfVar7 = (float *)((long)out + lVar14 + (ulong)(uVar6 * 4) * 0x10);
          *pfVar7 = fVar1;
          pfVar7[1] = fVar19;
          pfVar7[2] = fVar17;
          pfVar7[3] = fVar15;
          lVar14 = lVar14 + 0x20;
        } while ((ulong)uVar6 << 5 != lVar14);
      }
      iVar13 = iVar12 / 2;
      fVar1 = in[8];
      fVar17 = in[9];
      fVar16 = in[0xb];
      fVar19 = in[0xc];
      fVar15 = in[0xd];
      fVar18 = in[0xe];
      fVar20 = in[0xf];
      pfVar7 = out + (long)iVar13 + -4;
      *pfVar7 = in[10];
      out[(long)iVar13 + -3] = fVar18;
      out[(long)iVar13 + -2] = fVar17;
      out[(long)iVar13 + -1] = fVar15;
      if (0x3f < iVar12) {
        pfVar9 = in + 0x2c;
        iVar13 = uVar6 - 1;
        fVar17 = fVar16;
        fVar15 = fVar20;
        do {
          fVar18 = pfVar9[-3];
          fVar2 = pfVar9[-2];
          fVar16 = pfVar9[-1];
          fVar3 = *pfVar9;
          fVar4 = pfVar9[1];
          fVar5 = pfVar9[2];
          fVar20 = pfVar9[3];
          pfVar7[-4] = pfVar9[-4];
          pfVar7[-3] = fVar3;
          pfVar7[-2] = fVar17;
          pfVar7[-1] = fVar15;
          pfVar7[-8] = fVar2;
          pfVar7[-7] = fVar5;
          pfVar7[-6] = fVar18;
          pfVar7[-5] = fVar4;
          pfVar7 = pfVar7 + -8;
          pfVar9 = pfVar9 + 0x20;
          iVar13 = iVar13 + -1;
          fVar17 = fVar16;
          fVar15 = fVar20;
        } while (iVar13 != 0);
      }
      pfVar7[-4] = fVar1;
      pfVar7[-3] = fVar19;
      pfVar7[-2] = fVar16;
      pfVar7[-1] = fVar20;
      fVar1 = in[0x18];
      fVar17 = in[0x19];
      fVar16 = in[0x1b];
      fVar19 = in[0x1c];
      fVar15 = in[0x1d];
      fVar18 = in[0x1e];
      fVar20 = in[0x1f];
      pfVar9 = out + (long)iVar12 + -4;
      pfVar7 = out + (long)iVar12 + -4;
      *pfVar7 = in[0x1a];
      pfVar7[1] = fVar18;
      pfVar7[2] = fVar17;
      pfVar7[3] = fVar15;
      if (0x3f < iVar12) {
        pfVar7 = in + 0x3c;
        iVar12 = uVar6 - 1;
        fVar17 = fVar16;
        fVar15 = fVar20;
        do {
          fVar18 = pfVar7[-3];
          fVar2 = pfVar7[-2];
          fVar16 = pfVar7[-1];
          fVar3 = *pfVar7;
          fVar4 = pfVar7[1];
          fVar5 = pfVar7[2];
          fVar20 = pfVar7[3];
          pfVar9[-4] = pfVar7[-4];
          pfVar9[-3] = fVar3;
          pfVar9[-2] = fVar17;
          pfVar9[-1] = fVar15;
          pfVar9[-8] = fVar2;
          pfVar9[-7] = fVar5;
          pfVar9[-6] = fVar18;
          pfVar9[-5] = fVar4;
          pfVar9 = pfVar9 + -8;
          pfVar7 = pfVar7 + 0x20;
          iVar12 = iVar12 + -1;
          fVar17 = fVar16;
          fVar15 = fVar20;
        } while (iVar12 != 0);
      }
      pfVar9[-4] = fVar1;
      pfVar9[-3] = fVar19;
      pfVar9[-2] = fVar16;
      pfVar9[-1] = fVar20;
    }
    else {
      if (0x1f < iVar12) {
        lVar14 = 0;
        do {
          pfVar7 = (float *)((long)in + lVar14);
          fVar1 = *pfVar7;
          fVar17 = pfVar7[2];
          fVar16 = pfVar7[3];
          pfVar9 = (float *)((long)in + lVar14 + 0x10);
          fVar19 = *pfVar9;
          fVar15 = pfVar9[1];
          fVar18 = pfVar9[2];
          fVar20 = pfVar9[3];
          pfVar9 = out + lVar14 + 4;
          *pfVar9 = pfVar7[1];
          pfVar9[1] = fVar16;
          pfVar9[2] = fVar15;
          pfVar9[3] = fVar20;
          pfVar7 = out + lVar14;
          *pfVar7 = fVar1;
          pfVar7[1] = fVar17;
          pfVar7[2] = fVar19;
          pfVar7[3] = fVar18;
          pfVar9 = (float *)((long)in + lVar14 + (ulong)(uVar6 * 4) * 0x10);
          fVar1 = *pfVar9;
          fVar17 = pfVar9[2];
          fVar16 = pfVar9[3];
          pfVar7 = (float *)((long)in + lVar14 + (ulong)(uVar6 * 4) * 0x10 + 0x10);
          fVar19 = *pfVar7;
          fVar15 = pfVar7[1];
          fVar18 = pfVar7[2];
          fVar20 = pfVar7[3];
          pfVar7 = out + lVar14 + 0x14;
          *pfVar7 = pfVar9[1];
          pfVar7[1] = fVar16;
          pfVar7[2] = fVar15;
          pfVar7[3] = fVar20;
          pfVar7 = out + lVar14 + 0x10;
          *pfVar7 = fVar1;
          pfVar7[1] = fVar17;
          pfVar7[2] = fVar19;
          pfVar7[3] = fVar18;
          lVar14 = lVar14 + 0x20;
        } while ((ulong)uVar6 << 5 != lVar14);
      }
      iVar13 = iVar12 + 3;
      if (-1 < iVar12) {
        iVar13 = iVar12;
      }
      pfVar9 = out + (long)iVar12 + -0x18;
      pfVar7 = in + (iVar13 >> 2);
      pfVar11 = pfVar7 + 4;
      fVar1 = *pfVar7;
      fVar17 = pfVar7[1];
      fVar16 = pfVar7[2];
      fVar19 = pfVar7[3];
      if (0x3f < iVar12) {
        iVar13 = uVar6 - 1;
        fVar15 = fVar16;
        fVar18 = fVar19;
        do {
          fVar20 = *pfVar11;
          fVar2 = pfVar11[1];
          fVar3 = pfVar11[2];
          fVar4 = pfVar11[3];
          fVar5 = pfVar11[4];
          pfVar7 = pfVar11 + 5;
          fVar16 = pfVar11[6];
          fVar19 = pfVar11[7];
          pfVar11 = pfVar11 + 8;
          pfVar9[4] = *pfVar7;
          pfVar9[5] = fVar4;
          pfVar9[6] = fVar2;
          pfVar9[7] = fVar18;
          *pfVar9 = fVar5;
          pfVar9[1] = fVar3;
          pfVar9[2] = fVar20;
          pfVar9[3] = fVar15;
          pfVar9 = pfVar9 + -0x20;
          iVar13 = iVar13 + -1;
          fVar15 = fVar16;
          fVar18 = fVar19;
        } while (iVar13 != 0);
      }
      iVar13 = iVar12 * 3 + 3;
      if (-1 < iVar12 * 3) {
        iVar13 = iVar12 * 3;
      }
      pfVar8 = out + (long)iVar12 + -8;
      fVar15 = *pfVar11;
      fVar18 = pfVar11[1];
      fVar20 = pfVar11[2];
      fVar2 = pfVar11[3];
      pfVar9[4] = fVar17;
      pfVar9[5] = fVar2;
      pfVar9[6] = fVar18;
      pfVar9[7] = fVar19;
      *pfVar9 = fVar1;
      pfVar9[1] = fVar20;
      pfVar9[2] = fVar15;
      pfVar9[3] = fVar16;
      pfVar7 = in + (iVar13 >> 2);
      pfVar9 = pfVar7 + 4;
      fVar1 = *pfVar7;
      fVar17 = pfVar7[1];
      fVar16 = pfVar7[2];
      fVar19 = pfVar7[3];
      if (0x3f < iVar12) {
        iVar12 = uVar6 - 1;
        fVar15 = fVar16;
        fVar18 = fVar19;
        do {
          fVar20 = *pfVar9;
          fVar2 = pfVar9[1];
          fVar3 = pfVar9[2];
          fVar4 = pfVar9[3];
          fVar5 = pfVar9[4];
          pfVar7 = pfVar9 + 5;
          fVar16 = pfVar9[6];
          fVar19 = pfVar9[7];
          pfVar9 = pfVar9 + 8;
          pfVar8[4] = *pfVar7;
          pfVar8[5] = fVar4;
          pfVar8[6] = fVar2;
          pfVar8[7] = fVar18;
          *pfVar8 = fVar5;
          pfVar8[1] = fVar3;
          pfVar8[2] = fVar20;
          pfVar8[3] = fVar15;
          pfVar8 = pfVar8 + -0x20;
          iVar12 = iVar12 + -1;
          fVar15 = fVar16;
          fVar18 = fVar19;
        } while (iVar12 != 0);
      }
      fVar15 = *pfVar9;
      fVar18 = pfVar9[1];
      fVar20 = pfVar9[2];
      fVar2 = pfVar9[3];
      pfVar8[4] = fVar17;
      pfVar8[5] = fVar2;
      pfVar8[6] = fVar18;
      pfVar8[7] = fVar19;
      *pfVar8 = fVar1;
      pfVar8[1] = fVar20;
      pfVar8[2] = fVar15;
      pfVar8[3] = fVar16;
    }
  }
  else {
    uVar6 = setup->Ncvec;
    if (direction == PFFFT_FORWARD) {
      if (0 < (int)uVar6) {
        pfVar7 = in + 4;
        uVar10 = 0;
        do {
          iVar12 = ((uint)uVar10 & 3) * (uVar6 >> 2) + ((uint)(uVar10 >> 2) & 0x3fffffff);
          fVar1 = pfVar7[-4];
          fVar17 = pfVar7[-3];
          fVar16 = pfVar7[-1];
          fVar19 = *pfVar7;
          fVar15 = pfVar7[1];
          fVar18 = pfVar7[2];
          fVar20 = pfVar7[3];
          pfVar9 = out + (ulong)(iVar12 * 2 + 1) * 4;
          *pfVar9 = pfVar7[-2];
          pfVar9[1] = fVar18;
          pfVar9[2] = fVar16;
          pfVar9[3] = fVar20;
          pfVar9 = out + (ulong)(uint)(iVar12 * 2) * 4;
          *pfVar9 = fVar1;
          pfVar9[1] = fVar19;
          pfVar9[2] = fVar17;
          pfVar9[3] = fVar15;
          uVar10 = uVar10 + 1;
          pfVar7 = pfVar7 + 8;
        } while (uVar6 != uVar10);
      }
    }
    else if (0 < (int)uVar6) {
      pfVar7 = out + 4;
      uVar10 = 0;
      do {
        iVar12 = ((uint)uVar10 & 3) * (uVar6 >> 2) + ((uint)(uVar10 >> 2) & 0x3fffffff);
        pfVar9 = in + (ulong)(uint)(iVar12 * 2) * 4;
        fVar1 = *pfVar9;
        fVar17 = pfVar9[2];
        fVar16 = pfVar9[3];
        pfVar11 = in + (ulong)(iVar12 * 2 + 1) * 4;
        fVar19 = *pfVar11;
        fVar15 = pfVar11[1];
        fVar18 = pfVar11[2];
        fVar20 = pfVar11[3];
        *pfVar7 = pfVar9[1];
        pfVar7[1] = fVar16;
        pfVar7[2] = fVar15;
        pfVar7[3] = fVar20;
        pfVar7[-4] = fVar1;
        pfVar7[-3] = fVar17;
        pfVar7[-2] = fVar19;
        pfVar7[-1] = fVar18;
        uVar10 = uVar10 + 1;
        pfVar7 = pfVar7 + 8;
      } while (uVar6 != uVar10);
    }
  }
  return;
}

Assistant:

void pffft_zreorder(PFFFT_Setup *setup, const float *in, float *out, pffft_direction_t direction) {
  int k, N = setup->N, Ncvec = setup->Ncvec;
  const v4sf *vin = (const v4sf*)in;
  v4sf *vout = (v4sf*)out;
  assert(in != out);
  if (setup->transform == PFFFT_REAL) {
    int k, dk = N/32;
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < dk; ++k) {
        INTERLEAVE2(vin[k*8 + 0], vin[k*8 + 1], vout[2*(0*dk + k) + 0], vout[2*(0*dk + k) + 1]);
        INTERLEAVE2(vin[k*8 + 4], vin[k*8 + 5], vout[2*(2*dk + k) + 0], vout[2*(2*dk + k) + 1]);
      }
      reversed_copy(dk, vin+2, 8, (v4sf*)(out + N/2));
      reversed_copy(dk, vin+6, 8, (v4sf*)(out + N));
    } else {
      for (k=0; k < dk; ++k) {
        UNINTERLEAVE2(vin[2*(0*dk + k) + 0], vin[2*(0*dk + k) + 1], vout[k*8 + 0], vout[k*8 + 1]);
        UNINTERLEAVE2(vin[2*(2*dk + k) + 0], vin[2*(2*dk + k) + 1], vout[k*8 + 4], vout[k*8 + 5]);
      }
      unreversed_copy(dk, (v4sf*)(in + N/4), (v4sf*)(out + N - 6*SIMD_SZ), -8);
      unreversed_copy(dk, (v4sf*)(in + 3*N/4), (v4sf*)(out + N - 2*SIMD_SZ), -8);
    }
  } else {
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        INTERLEAVE2(vin[k*2], vin[k*2+1], vout[kk*2], vout[kk*2+1]);
      }
    } else {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        UNINTERLEAVE2(vin[kk*2], vin[kk*2+1], vout[k*2], vout[k*2+1]);
      }
    }
  }
}